

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void wipe_obj_list(void)

{
  object_menu_data *buf;
  long lVar1;
  bool bVar2;
  
  num_obj = L'\0';
  num_head = L'\0';
  max_len = 0;
  ex_width = L'\0';
  ex_offset = L'\0';
  lVar1 = 0x32;
  buf = items;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    my_strcpy(buf->label,"",0x50);
    my_strcpy(buf->equip_label,"",0x50);
    buf->object = (object *)0x0;
    my_strcpy(buf->o_name,"",0x50);
    buf->key = '\0';
    buf = buf + 1;
  }
  return;
}

Assistant:

static void wipe_obj_list(void)
{
	int i;

	/* Zero the constants */
	num_obj = 0;
	num_head = 0;
	max_len = 0;
	ex_width = 0;
	ex_offset = 0;

	/* Clear the existing contents */
	for (i = 0; i < MAX_ITEMS; i++) {
		my_strcpy(items[i].label, "", sizeof(items[i].label));
		my_strcpy(items[i].equip_label, "", sizeof(items[i].equip_label));
		items[i].object = NULL;
		my_strcpy(items[i].o_name, "", sizeof(items[i].o_name));
		items[i].key = '\0';
	}
}